

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx *cctx,rawSeq *seq,size_t nbSeq)

{
  size_t nbSeq_local;
  rawSeq *seq_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->stage == ZSTDcs_init) {
    if ((cctx->appliedParams).ldmParams.enableLdm == 0) {
      (cctx->externSeqStore).seq = seq;
      (cctx->externSeqStore).size = nbSeq;
      (cctx->externSeqStore).capacity = nbSeq;
      (cctx->externSeqStore).pos = 0;
      cctx_local = (ZSTD_CCtx *)0x0;
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffd8;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx* cctx, rawSeq* seq, size_t nbSeq)
{
    if (cctx->stage != ZSTDcs_init)
        return ERROR(stage_wrong);
    if (cctx->appliedParams.ldmParams.enableLdm)
        return ERROR(parameter_unsupported);
    cctx->externSeqStore.seq = seq;
    cctx->externSeqStore.size = nbSeq;
    cctx->externSeqStore.capacity = nbSeq;
    cctx->externSeqStore.pos = 0;
    return 0;
}